

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gimli-core.h
# Opt level: O2

void gimli_core_u8(uint8_t *state_u8,uint8_t tag)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  state_u8[0x2f] = state_u8[0x2f] ^ tag;
  auVar6 = *(undefined1 (*) [16])state_u8;
  auVar8 = *(undefined1 (*) [16])(state_u8 + 0x10);
  auVar5 = *(undefined1 (*) [16])(state_u8 + 0x20);
  uVar1 = 5;
  while (-1 < (int)uVar1) {
    auVar3 = vprold_avx512vl(auVar8,9);
    auVar4 = vprold_avx512vl(auVar6,0x18);
    uVar2 = (ulong)uVar1;
    auVar6 = vpaddd_avx(auVar5,auVar5);
    uVar1 = uVar1 - 1;
    auVar8 = vpand_avx(auVar4,auVar3);
    auVar7 = vpand_avx(auVar5,auVar3);
    auVar8 = vpslld_avx(auVar8,3);
    auVar7 = vpslld_avx(auVar7,2);
    auVar8 = vpternlogd_avx512vl(auVar8,auVar3,auVar5,0x96);
    auVar7 = vpternlogq_avx512vl(auVar7,auVar4,auVar6,0x96);
    auVar6 = vpor_avx(auVar5,auVar4);
    auVar5 = vpshufd_avx(auVar8,0xb1);
    auVar6 = vpaddd_avx(auVar6,auVar6);
    auVar8 = vpternlogd_avx512vl(auVar6,auVar3,auVar4,0x96);
    auVar6 = vpaddd_avx(auVar7,auVar7);
    auVar3 = vprold_avx512vl(auVar8,9);
    auVar8 = vpand_avx(auVar7,auVar3);
    auVar8 = vpslld_avx(auVar8,2);
    auVar5 = vprold_avx512vl(auVar5 ^ *(undefined1 (*) [16])(coeffs + uVar2 * 4),0x18);
    auVar4 = vpternlogq_avx512vl(auVar8,auVar5,auVar6,0x96);
    auVar6 = vpor_avx(auVar7,auVar5);
    auVar8 = vpand_avx(auVar5,auVar3);
    auVar6 = vpaddd_avx(auVar6,auVar6);
    auVar9 = vpslld_avx(auVar8,3);
    auVar8 = vpternlogd_avx512vl(auVar6,auVar3,auVar5,0x96);
    auVar5 = vpternlogd_avx512vl(auVar9,auVar7,auVar3,0x96);
    auVar6 = vpaddd_avx(auVar4,auVar4);
    auVar7 = vprold_avx512vl(auVar8,9);
    auVar5 = vprold_avx512vl(auVar5,0x18);
    auVar8 = vpand_avx(auVar4,auVar7);
    auVar3 = vpslld_avx(auVar8,2);
    auVar8 = vpand_avx(auVar5,auVar7);
    auVar3 = vpternlogq_avx512vl(auVar3,auVar5,auVar6,0x96);
    auVar6 = vpor_avx(auVar4,auVar5);
    auVar8 = vpslld_avx(auVar8,3);
    auVar6 = vpaddd_avx(auVar6,auVar6);
    auVar8 = vpternlogd_avx512vl(auVar8,auVar7,auVar4,0x96);
    auVar6 = vpternlogd_avx512vl(auVar6,auVar7,auVar5,0x96);
    auVar7 = vpshufb_avx(auVar8,_DAT_00109640);
    auVar4 = vprold_avx512vl(auVar6,9);
    auVar6 = vpaddd_avx(auVar3,auVar3);
    auVar8 = vpand_avx(auVar3,auVar4);
    auVar8 = vpslld_avx(auVar8,2);
    auVar5 = vpternlogq_avx512vl(auVar8,auVar7,auVar6,0x96);
    auVar6 = vpor_avx(auVar3,auVar7);
    auVar6 = vpaddd_avx(auVar6,auVar6);
    auVar8 = vpternlogq_avx512vl(auVar6,auVar7,auVar4,0x96);
    auVar6 = vpand_avx(auVar7,auVar4);
    auVar6 = vpslld_avx(auVar6,3);
    auVar6 = vpternlogq_avx512vl(auVar6,auVar3,auVar4,0x96);
  }
  *(undefined1 (*) [16])state_u8 = auVar6;
  *(undefined1 (*) [16])(state_u8 + 0x10) = auVar8;
  *(undefined1 (*) [16])(state_u8 + 0x20) = auVar5;
  return;
}

Assistant:

static void
gimli_core_u8(uint8_t state_u8[gimli_BLOCKBYTES], uint8_t tag)
{
    state_u8[gimli_BLOCKBYTES - 1] ^= tag;
#ifndef NATIVE_LITTLE_ENDIAN
    uint32_t state_u32[12];
    int      i;

    for (i = 0; i < 12; i++) {
        state_u32[i] = LOAD32_LE(&state_u8[i * 4]);
    }
    gimli_core(state_u32);
    for (i = 0; i < 12; i++) {
        STORE32_LE(&state_u8[i * 4], state_u32[i]);
    }
#else
    gimli_core((uint32_t *) (void *) state_u8); /* state_u8 must be properly aligned */
#endif
}